

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::ServiceDescriptor::CopyTo(ServiceDescriptor *this,ServiceDescriptorProto *proto)

{
  int iVar1;
  long lVar2;
  void **ppvVar3;
  string *psVar4;
  MethodDescriptorProto *proto_00;
  ServiceOptions *pSVar5;
  ServiceOptions *pSVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  
  proto->_has_bits_[0] = proto->_has_bits_[0] | 1;
  psVar4 = proto->name_;
  if (psVar4 == (string *)internal::kEmptyString_abi_cxx11_) {
    psVar4 = (string *)operator_new(0x20);
    (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
    psVar4->_M_string_length = 0;
    (psVar4->field_2)._M_local_buf[0] = '\0';
    proto->name_ = psVar4;
  }
  std::__cxx11::string::_M_assign((string *)psVar4);
  if (0 < *(int *)(this + 0x20)) {
    lVar9 = 0;
    lVar7 = 0;
    do {
      lVar2 = *(long *)(this + 0x28);
      iVar1 = (proto->method_).super_RepeatedPtrFieldBase.current_size_;
      iVar8 = (proto->method_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar1 < iVar8) {
        ppvVar3 = (proto->method_).super_RepeatedPtrFieldBase.elements_;
        (proto->method_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        proto_00 = (MethodDescriptorProto *)ppvVar3[iVar1];
      }
      else {
        if (iVar8 == (proto->method_).super_RepeatedPtrFieldBase.total_size_) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(proto->method_).super_RepeatedPtrFieldBase,iVar8 + 1);
          iVar8 = (proto->method_).super_RepeatedPtrFieldBase.allocated_size_;
        }
        (proto->method_).super_RepeatedPtrFieldBase.allocated_size_ = iVar8 + 1;
        proto_00 = internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>::New();
        ppvVar3 = (proto->method_).super_RepeatedPtrFieldBase.elements_;
        iVar1 = (proto->method_).super_RepeatedPtrFieldBase.current_size_;
        (proto->method_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        ppvVar3[iVar1] = proto_00;
      }
      MethodDescriptor::CopyTo((MethodDescriptor *)(lVar2 + lVar9),proto_00);
      lVar7 = lVar7 + 1;
      lVar9 = lVar9 + 0x30;
    } while (lVar7 < *(int *)(this + 0x20));
  }
  pSVar6 = *(ServiceOptions **)(this + 0x18);
  pSVar5 = ServiceOptions::default_instance();
  if (pSVar6 != pSVar5) {
    *(byte *)proto->_has_bits_ = (byte)proto->_has_bits_[0] | 4;
    pSVar6 = proto->options_;
    if (pSVar6 == (ServiceOptions *)0x0) {
      pSVar6 = (ServiceOptions *)operator_new(0x60);
      ServiceOptions::ServiceOptions(pSVar6);
      proto->options_ = pSVar6;
    }
    ServiceOptions::CopyFrom(pSVar6,*(ServiceOptions **)(this + 0x18));
    return;
  }
  return;
}

Assistant:

void ServiceDescriptor::CopyTo(ServiceDescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < method_count(); i++) {
    method(i)->CopyTo(proto->add_method());
  }

  if (&options() != &ServiceOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}